

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  uchar localRegisterID;
  ushort uVar1;
  undefined8 instance_00;
  bool bVar2;
  PropertyId PVar3;
  Var pvVar4;
  Var pvVar5;
  InlineCache *pIVar6;
  RecyclableObject *object;
  ScriptContext *requestContext;
  FunctionBody *pFVar7;
  Var local_90;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *thisObj;
  RecyclableObject *superObj;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var thisInstance;
  Var instance;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar4 = GetReg<unsigned_char>(this,playout->Instance);
  pvVar5 = GetReg<unsigned_char>(this,playout->Value2);
  pIVar6 = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  PVar3 = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  bVar2 = VarIs<Js::RecyclableObject>(pvVar4);
  if ((bVar2) && (bVar2 = VarIs<Js::RecyclableObject>(pvVar5), bVar2)) {
    object = VarTo<Js::RecyclableObject>(pvVar4);
    info._56_8_ = VarTo<Js::RecyclableObject>(pvVar5);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    pFVar7 = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,pFVar7,pIVar6,(uint)playout->PropertyIdIndex,true);
    instance_00 = info._56_8_;
    requestContext = GetScriptContext(this);
    bVar2 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)instance_00,false,object,PVar3,&local_90,requestContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
    if (bVar2) {
      SetReg<unsigned_char>(this,playout->Value,local_90);
      return;
    }
  }
  localRegisterID = playout->Value;
  pFVar7 = GetFunctionBody(this);
  pIVar6 = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  uVar1 = playout->PropertyIdIndex;
  pvVar4 = GetReg<unsigned_char>(this,playout->Instance);
  PVar3 = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  pvVar5 = GetReg<unsigned_char>(this,playout->Value2);
  pvVar4 = Js::JavascriptOperators::PatchGetValueWithThisPtr<false,Js::InlineCache>
                     (pFVar7,pIVar6,(uint)uVar1,pvVar4,PVar3,pvVar5);
  SetReg<unsigned_char>(this,localRegisterID,pvVar4);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetSuperProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Var instance = GetReg(playout->Instance);
        Var thisInstance = GetReg(playout->Value2);
        InlineCache *inlineCache = GetInlineCache(playout->PropertyIdIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->PropertyIdIndex);
        if (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance))
        {
            RecyclableObject* superObj = VarTo<RecyclableObject>(instance);
            RecyclableObject* thisObj = VarTo<RecyclableObject>(thisInstance);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->PropertyIdIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                thisObj, false, superObj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetValueWithThisPtr<false>(
                GetFunctionBody(),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetReg(playout->Value2)));
    }